

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  ReporterPreferences *__position;
  Config *pCVar1;
  undefined8 *puVar2;
  long *plVar3;
  TestCaseHandle **ppTVar4;
  IStreamingReporter *pIVar5;
  long lVar6;
  Session *pSVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar14;
  undefined4 extraout_var;
  undefined8 *puVar15;
  undefined **ppuVar16;
  undefined4 extraout_var_00;
  long *plVar17;
  ListeningReporter *this_00;
  undefined4 extraout_var_01;
  long *plVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Rb_tree_node_base *p_Var19;
  char *pcVar20;
  TestCaseInfo **testInfo;
  IStreamingReporter *pIVar21;
  pointer pFVar22;
  TestCaseHandle **__v;
  const_iterator __begin3_1;
  long lVar23;
  int iVar24;
  pointer pFVar25;
  IStreamingReporterPtr reporter;
  Totals totals;
  long local_340;
  IStreamingReporterPtr local_338;
  long local_330;
  undefined1 local_328 [32];
  size_t local_308;
  size_t sStack_300;
  size_t local_2f8;
  Session *local_2f0;
  undefined1 local_2e8 [32];
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2a8 [16];
  long local_290;
  undefined1 local_288 [16];
  IStreamingReporterPtr local_270;
  Config *local_268;
  RunContext local_260;
  IStreamingReporter local_78;
  undefined8 local_68;
  _Rb_tree_node_base *local_60;
  ReporterPreferences *local_58;
  undefined1 local_50 [8];
  undefined1 auStack_48 [16];
  pointer pFStack_38;
  
  iVar12 = 1;
  if (((this->m_startupExceptions != false) || (iVar12 = 0, (this->m_configData).showHelp != false))
     || ((this->m_configData).libIdentify != false)) {
    return iVar12;
  }
  config(this);
  pCVar1 = (this->m_config).m_ptr;
  if (pCVar1 != (Config *)0x0) {
    seedRng(&pCVar1->super_IConfig);
    if ((this->m_configData).filenamesAsTags == true) {
      pSVar14 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar12 = (*(pSVar14->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar14);
      puVar15 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar12) + 0x10))
                          ((long *)CONCAT44(extraout_var,iVar12));
      puVar2 = (undefined8 *)puVar15[1];
      for (puVar15 = (undefined8 *)*puVar15; puVar15 != puVar2; puVar15 = puVar15 + 1) {
        TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar15);
      }
    }
    if (IMutableContext::currentContext == (undefined8 *)0x0) {
      IMutableContext::currentContext = (undefined8 *)operator_new(0x20);
      ppuVar16 = &PTR__Context_001bac90;
      *IMutableContext::currentContext = &PTR__Context_001bac90;
      *(undefined1 (*) [16])(IMutableContext::currentContext + 1) = (undefined1  [16])0x0;
      IMutableContext::currentContext[3] = 0;
    }
    else {
      ppuVar16 = (undefined **)*IMutableContext::currentContext;
    }
    (*(code *)ppuVar16[7])(IMutableContext::currentContext,(this->m_config).m_ptr);
    pCVar1 = (this->m_config).m_ptr;
    pSVar14 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar12 = (*(pSVar14->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar14);
    plVar17 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar12) + 0x20))
                                ((long *)CONCAT44(extraout_var_00,iVar12));
    local_2f0 = this;
    if (*plVar17 == plVar17[1]) {
      anon_unknown_23::createReporter
                ((anon_unknown_23 *)&local_338,&(pCVar1->m_data).reporterName,&pCVar1->super_IConfig
                );
    }
    else {
      this_00 = (ListeningReporter *)operator_new(0x30);
      (this_00->super_IStreamingReporter).m_preferences.shouldRedirectStdOut = false;
      (this_00->super_IStreamingReporter).m_preferences.shouldReportAllAssertions = true;
      (this_00->super_IStreamingReporter)._vptr_IStreamingReporter =
           (_func_int **)&PTR__ListeningReporter_001b9a98;
      (this_00->m_listeners).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->m_listeners).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &(this_00->m_listeners).
        super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      local_338.m_ptr = (IStreamingReporter *)this_00;
      pSVar14 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar12 = (*(pSVar14->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar14);
      plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar12) + 0x20))
                                  ((long *)CONCAT44(extraout_var_01,iVar12));
      plVar17 = (long *)*plVar18;
      plVar18 = (long *)plVar18[1];
      if (plVar17 != plVar18) {
        do {
          plVar3 = (long *)*plVar17;
          if (plVar3 == (long *)0x0) {
            pcVar20 = 
            "T *Catch::Detail::unique_ptr<Catch::IReporterFactory>::operator->() const [T = Catch::IReporterFactory]"
            ;
            goto LAB_00145774;
          }
          iVar12 = (*(pCVar1->super_IConfig)._vptr_IConfig[3])(pCVar1);
          local_270.m_ptr = (IStreamingReporter *)CONCAT44(extraout_var_02,iVar12);
          local_268 = pCVar1;
          (**(code **)(*plVar3 + 0x10))
                    ((unique_ptr<Catch::IStreamingReporter> *)local_328,plVar3,&local_270);
          std::
          vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
          ::emplace_back<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>
                    ((vector<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>>>
                      *)&this_00->m_listeners,(unique_ptr<Catch::IStreamingReporter> *)local_328);
          if ((IStreamingReporter *)local_328._0_8_ != (IStreamingReporter *)0x0) {
            (**(code **)(*(long *)local_328._0_8_ + 8))();
          }
          plVar17 = plVar17 + 1;
        } while (plVar17 != plVar18);
      }
      anon_unknown_23::createReporter
                ((anon_unknown_23 *)&local_270,&(pCVar1->m_data).reporterName,&pCVar1->super_IConfig
                );
      ListeningReporter::addReporter(this_00,&local_270);
      this = local_2f0;
      if ((ListeningReporter *)local_270.m_ptr != (ListeningReporter *)0x0) {
        (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter[1])();
      }
    }
    if ((ListeningReporter *)local_338.m_ptr == (ListeningReporter *)0x0) {
      pcVar20 = 
      "T &Catch::Detail::unique_ptr<Catch::IStreamingReporter>::operator*() [T = Catch::IStreamingReporter]"
      ;
      goto LAB_001457aa;
    }
    pCVar1 = (this->m_config).m_ptr;
    if (pCVar1 != (Config *)0x0) {
      bVar11 = list(local_338.m_ptr,pCVar1);
      iVar12 = 0;
      if (!bVar11) {
        local_268 = (this->m_config).m_ptr;
        local_270.m_ptr = local_338.m_ptr;
        RunContext::RunContext(&local_260,&local_268->super_IConfig,&local_338);
        pCVar1 = local_268;
        __position = &local_78.m_preferences;
        local_78.m_preferences.shouldRedirectStdOut = false;
        local_78.m_preferences.shouldReportAllAssertions = false;
        local_78._10_2_ = 0;
        local_68 = 0;
        _local_50 = (undefined1  [16])0x0;
        stack0xffffffffffffffc0 = (undefined1  [16])0x0;
        local_60 = (_Rb_tree_node_base *)__position;
        local_58 = __position;
        pSVar14 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar12 = (*(pSVar14->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar14);
        testCases = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar12) + 0x20))
                              ((long *)CONCAT44(extraout_var_03,iVar12),pCVar1);
        iVar12 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
        TestSpec::matchesByFilter
                  ((Matches *)local_2e8,(TestSpec *)CONCAT44(extraout_var_04,iVar12),testCases,
                   &local_268->super_IConfig);
        auVar9 = _local_50;
        local_328._16_8_ = pFStack_38;
        auStack_48._4_4_ = local_2e8._4_4_;
        auStack_48._0_4_ = local_2e8._0_4_;
        uVar10 = auStack_48._0_8_;
        local_328._8_8_ = auStack_48._8_8_;
        auStack_48._0_8_ = auVar9._8_8_;
        local_328._0_8_ = auStack_48._0_8_;
        local_50 = auVar9._0_8_;
        _local_50 = CONCAT88(uVar10,local_50);
        pFStack_38 = (pointer)local_2e8._16_8_;
        auStack_48._8_8_ = local_2e8._8_8_;
        local_2e8._0_4_ = 0;
        local_2e8._4_4_ = 0;
        local_2e8._8_8_ = (pointer)0x0;
        local_2e8._16_8_ = (pointer)0x0;
        std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 *)local_328);
        std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 *)local_2e8);
        iVar12 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
        uVar10 = auStack_48._8_8_;
        if (auStack_48._0_8_ == auStack_48._8_8_) {
          if (*(long *)(CONCAT44(extraout_var_05,iVar12) + 0x18) ==
              *(long *)(CONCAT44(extraout_var_05,iVar12) + 0x20)) {
            pIVar21 = (IStreamingReporter *)
                      (testCases->
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pIVar5 = (IStreamingReporter *)
                     (testCases->
                     super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (pIVar21 != pIVar5) {
              do {
                if ((((TestCaseInfo *)pIVar21->_vptr_IStreamingReporter)->properties & IsHidden) ==
                    None) {
                  local_328._0_8_ = pIVar21;
                  std::
                  _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  ::_M_emplace_unique<Catch::TestCaseHandle_const*>
                            ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                              *)&local_78,(TestCaseHandle **)local_328);
                }
                pIVar21 = pIVar21 + 1;
              } while (pIVar21 != pIVar5);
            }
          }
        }
        else {
          lVar23 = auStack_48._0_8_;
          do {
            ppTVar4 = *(TestCaseHandle ***)(lVar23 + 0x28);
            local_328._0_8_ = &local_78;
            for (__v = *(TestCaseHandle ***)(lVar23 + 0x20); __v != ppTVar4; __v = __v + 1) {
              std::
              _Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
              ::
              _M_insert_unique_<Catch::TestCaseHandle_const*const&,std::_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>::_Alloc_node>
                        ((_Rb_tree<Catch::TestCaseHandle_const*,Catch::TestCaseHandle_const*,std::_Identity<Catch::TestCaseHandle_const*>,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                          *)&local_78,(const_iterator)__position,__v,(_Alloc_node *)local_328);
            }
            lVar23 = lVar23 + 0x38;
          } while (lVar23 != uVar10);
        }
        iVar12 = (*(local_268->super_IConfig)._vptr_IConfig[0xd])();
        local_2e8._0_4_ = 0;
        local_2e8._8_8_ = (pointer)0x0;
        local_2e8._16_8_ = (pointer)0x0;
        stack0xfffffffffffffd30 = (undefined1  [16])0x0;
        local_2c0 = (undefined1  [16])0x0;
        (*(local_268->super_IConfig)._vptr_IConfig[4])(local_328);
        RunContext::testGroupStarting(&local_260,(string *)local_328,1,1);
        if ((IStreamingReporter *)local_328._0_8_ != (IStreamingReporter *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
        }
        pFVar25 = (pointer)0x0;
        local_290 = CONCAT44(extraout_var_06,iVar12);
        if (local_60 != (_Rb_tree_node_base *)__position) {
          local_288 = (undefined1  [16])0x0;
          local_330 = 0;
          local_340 = 0;
          pFVar25 = (pointer)0x0;
          pFVar22 = (pointer)0x0;
          local_2a8 = (undefined1  [16])0x0;
          p_Var19 = local_60;
          do {
            sVar8 = local_260.m_totals.assertions.failed;
            iVar12 = (*(local_260.m_config)->_vptr_IConfig[9])();
            if (sVar8 < (ulong)(long)iVar12) {
              RunContext::runTest((Totals *)local_328,&local_260,*(TestCaseHandle **)(p_Var19 + 1));
              pFVar22 = (pointer)((long)&(pFVar22->name)._M_dataplus._M_p + local_328._8_8_);
              pFVar25 = (pointer)((long)&(pFVar25->name)._M_dataplus._M_p + local_328._16_8_);
              local_340 = local_340 + local_328._24_8_;
              local_330 = local_330 + local_2f8;
              local_2a8._8_8_ = sStack_300 + local_288._8_8_;
              local_2a8._0_8_ = local_308 + local_288._0_8_;
              local_288._8_8_ = sStack_300 + local_288._8_8_;
              local_288._0_8_ = local_308 + local_288._0_8_;
            }
            else {
              (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
                _vptr_IStreamingReporter[0x12])(local_270.m_ptr,**(undefined8 **)(p_Var19 + 1));
            }
            p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
          } while (p_Var19 != (_Rb_tree_node_base *)__position);
          uStack_2c8 = local_2a8._0_8_;
          local_2e8._24_8_ = local_340;
          local_2c0._8_8_ = local_330;
          local_2c0._0_8_ = local_2a8._8_8_;
          local_2e8._8_8_ = pFVar22;
          local_2e8._16_8_ = pFVar25;
        }
        iVar24 = 0;
        iVar12 = local_2e8._0_4_;
        if (auStack_48._0_8_ != auStack_48._8_8_) {
          iVar24 = 0;
          lVar23 = auStack_48._0_8_;
          do {
            if (*(long *)(lVar23 + 0x20) == *(long *)(lVar23 + 0x28)) {
              iVar24 = -1;
              (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
                _vptr_IStreamingReporter[2])(local_270.m_ptr,lVar23);
            }
            lVar23 = lVar23 + 0x38;
            iVar12 = iVar24;
          } while (lVar23 != auStack_48._8_8_);
        }
        local_2e8._0_4_ = iVar12;
        lVar6 = *(long *)(local_290 + 0x20);
        for (lVar23 = *(long *)(local_290 + 0x18); lVar23 != lVar6; lVar23 = lVar23 + 0x20) {
          (*((IStreamingReporter *)&(local_270.m_ptr)->_vptr_IStreamingReporter)->
            _vptr_IStreamingReporter[3])(local_270.m_ptr,lVar23);
        }
        (*(local_268->super_IConfig)._vptr_IConfig[4])(local_328);
        RunContext::testGroupEnded(&local_260,(string *)local_328,(Totals *)local_2e8,1,1);
        pSVar7 = local_2f0;
        if ((IStreamingReporter *)local_328._0_8_ != (IStreamingReporter *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,(ulong)(local_328._16_8_ + 1));
        }
        pCVar1 = (pSVar7->m_config).m_ptr;
        if (pCVar1 == (Config *)0x0) {
          pcVar20 = 
          "T *Catch::Detail::unique_ptr<Catch::Config>::operator->() const [T = Catch::Config]";
LAB_00145774:
          __assert_fail("m_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                        ,0x4b8,pcVar20);
        }
        iVar13 = (*(pCVar1->super_IConfig)._vptr_IConfig[8])();
        iVar12 = 2;
        if (((byte)iVar13 & iVar24 == -1) == 0) {
          iVar12 = (int)pFVar25;
          if ((int)pFVar25 < iVar24) {
            iVar12 = iVar24;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
        }
        std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 *)(local_50 + 8));
        std::
        _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ::~_Rb_tree((_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                     *)&local_78);
        RunContext::~RunContext(&local_260);
      }
      if ((ListeningReporter *)local_338.m_ptr == (ListeningReporter *)0x0) {
        return iVar12;
      }
      (*((IStreamingReporter *)&(local_338.m_ptr)->_vptr_IStreamingReporter)->
        _vptr_IStreamingReporter[1])();
      return iVar12;
    }
  }
  pcVar20 = "T &Catch::Detail::unique_ptr<Catch::Config>::operator*() [T = Catch::Config]";
LAB_001457aa:
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x4b0,pcVar20);
}

Assistant:

int Session::runInternal() {
        if (m_startupExceptions)
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY{
            config(); // Force config to be constructed

            seedRng(*m_config);

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = makeReporter(m_config.get());

            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { std::move(reporter), m_config.get() };
            auto const totals = tests.execute();

            if (m_config->warnAboutNoTests() && totals.error == -1)
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min)(MaxExitCode, (std::max)(totals.error, static_cast<int>(totals.assertions.failed)));
        }